

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syms.c
# Opt level: O0

symtbl_t * find_scope_id(symtbl_t *s,int scope_id)

{
  symtbl_t *psVar1;
  int in_ESI;
  symtbl_t *in_RDI;
  symtbl_t *ret;
  uint i;
  undefined8 in_stack_ffffffffffffffe0;
  uint uVar2;
  symtbl_t *local_8;
  
  local_8 = in_RDI;
  if (in_RDI->scope_id != in_ESI) {
    for (uVar2 = 0; uVar2 < in_RDI->num_children; uVar2 = uVar2 + 1) {
      if (in_RDI->children[uVar2]->scope_id == in_ESI) {
        return in_RDI->children[uVar2];
      }
      psVar1 = find_scope_id((symtbl_t *)CONCAT44(in_ESI,uVar2),
                             (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
      if (psVar1 != (symtbl_t *)0x0) {
        return psVar1;
      }
      in_stack_ffffffffffffffe0 = 0;
    }
    local_8 = (symtbl_t *)0x0;
  }
  return local_8;
}

Assistant:

symtbl_t* find_scope_id(symtbl_t* s, int scope_id)
{
    unsigned int i;
    symtbl_t* ret;
    if (s->scope_id == scope_id)
        return s;

    for (i = 0; i < s->num_children; i++)
    {
        if (s->children[i]->scope_id == scope_id)
            return s->children[i];

        ret = find_scope_id(s->children[i], scope_id);
        if (ret)
            return ret;
    }
    return NULL;
}